

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O2

bool t_py_generator::is_immutable(t_type *ttype)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  iterator iVar4;
  allocator local_39;
  key_type local_38;
  
  std::__cxx11::string::string((string *)&local_38,"python.immutable",&local_39);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(ttype->annotations_)._M_t,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if ((_Rb_tree_header *)iVar4._M_node == &(ttype->annotations_)._M_t._M_impl.super__Rb_tree_header)
  {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype);
    uVar2 = (undefined1)iVar3;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (iVar4._M_node + 2),"false");
    uVar2 = !bVar1;
  }
  return (bool)uVar2;
}

Assistant:

static bool is_immutable(t_type* ttype) {
    std::map<std::string, std::string>::iterator it = ttype->annotations_.find("python.immutable");

    if (it == ttype->annotations_.end()) {
      // Exceptions are immutable by default.
      return ttype->is_xception();
    } else if (it->second == "false") {
      return false;
    } else {
      return true;
    }
  }